

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingResponder.hpp
# Opt level: O1

void __thiscall
ableton::link::
PingResponder<ableton::platforms::asio::AsioService&,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::reply<unsigned_char_const*>(Impl *this,uchar *begin,uchar *end,endpoint *to)

{
  _Type auVar1;
  longlong lVar2;
  uchar *__dest;
  int in_R8D;
  size_t __n;
  MessageBuffer pongBuffer;
  Payload<ableton::link::SessionMembership,_ableton::discovery::Payload<ableton::link::GHostTime,_ableton::discovery::Payload<>_>_>
  local_260;
  timespec local_230 [32];
  
  auVar1 = *(_Type *)(this + 0x10);
  clock_gettime(1,local_230);
  lVar2 = llround((double)((ulong)(local_230[0].tv_sec * 1000000000 +
                                  CONCAT71(local_230[0].tv_nsec._1_7_,
                                           (undefined1)local_230[0].tv_nsec)) / 1000) *
                  *(double *)(this + 0x18));
  local_260.mRest.mFirst.value.time.__r = lVar2 + *(long *)(this + 0x20);
  local_260.mFirst.header.key = 0x73657373;
  local_260.mFirst.header.size = 8;
  local_260.mRest.mFirst.header.key = 0x5f5f6774;
  local_260.mRest.mFirst.header.size = 8;
  local_230[0].tv_sec = 0x1765f6b6e696c5f;
  local_230[0].tv_nsec._0_1_ = 2;
  local_260.mFirst.value.sessionId.super_NodeIdArray._M_elems = (SessionId)(SessionId)auVar1;
  __dest = discovery::toNetworkByteStream<unsigned_char*>
                     (&local_260,(uchar *)((long)&local_230[0].tv_nsec + 1));
  __n = (long)end - (long)begin;
  if (__n != 0) {
    memmove(__dest,begin,__n);
  }
  discovery::Socket<512UL>::send
            ((Socket<512UL> *)(this + 0x30),(int)local_230,__dest + (__n - (long)local_230),
             (size_t)to,in_R8D);
  return;
}

Assistant:

void reply(It begin, It end, const asio::ip::udp::endpoint& to)
    {
      using namespace discovery;

      // Encode Pong Message
      const auto id = SessionMembership{mSessionId};
      const auto currentGt = GHostTime{mGhostXForm.hostToGhost(mClock.micros())};
      const auto pongPayload = makePayload(id, currentGt);

      v1::MessageBuffer pongBuffer;
      const auto pongMsgBegin = std::begin(pongBuffer);
      auto pongMsgEnd = v1::pongMessage(pongPayload, pongMsgBegin);
      // Append ping payload to pong message.
      pongMsgEnd = std::copy(begin, end, pongMsgEnd);

      const auto numBytes =
        static_cast<std::size_t>(std::distance(pongMsgBegin, pongMsgEnd));
      mSocket.send(pongBuffer.data(), numBytes, to);
    }